

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11JsonConfig.cpp
# Opt level: O3

HelicsConfigJSON * helics::addJsonConfig(App *app)

{
  HelicsConfigJSON *pHVar1;
  HelicsConfigJSON *pHVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Option *pOVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<helics::HelicsConfigJSON> fmtr;
  undefined1 local_129;
  HelicsConfigJSON *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  HelicsConfigJSON *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_128 = (HelicsConfigJSON *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::HelicsConfigJSON,std::allocator<helics::HelicsConfigJSON>>
            (&_Stack_120,&local_128,(allocator<helics::HelicsConfigJSON> *)&local_129);
  pHVar1 = local_128;
  app->allow_config_extras_ = ignore_all;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--config_section","");
  pHVar2 = local_128;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"specify the section of the config file to use","");
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_58,&(pHVar2->super_ConfigBase).configSection,&local_78);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  pOVar4->trigger_on_result_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"--config_index","");
  pHVar2 = local_128;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "specify the section index of the config file to use for configuration arrays","");
  pOVar4 = CLI::App::add_option<short,_short,_(CLI::detail::enabler)0>
                     (app,&local_98,&(pHVar2->super_ConfigBase).configIndex,&local_b8);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  pOVar4->trigger_on_result_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_pi = _Stack_120._M_pi;
  pHVar2 = local_128;
  pOVar4 = app->config_ptr_;
  if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_120._M_pi)->_M_use_count = (_Stack_120._M_pi)->_M_use_count + 1;
    }
  }
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x10);
  *(HelicsConfigJSON **)local_118._M_unused._0_8_ = pHVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_118._M_unused._0_8_ + 8) =
       _Var3._M_pi;
  pcStack_100 = CLI::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/helicsCLI11JsonConfig.cpp:135:34)>
                ::_M_invoke;
  local_108 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/helicsCLI11JsonConfig.cpp:135:34)>
              ::_M_manager;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  std::vector<CLI::Validator,std::allocator<CLI::Validator>>::
  emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&,std::__cxx11::string,std::__cxx11::string>
            ((vector<CLI::Validator,std::allocator<CLI::Validator>> *)&pOVar4->validators_,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_118,&local_d8,&local_f8);
  (pOVar4->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].non_modifying_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  pHVar2 = local_128;
  local_38 = local_128;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_120._M_pi;
  local_128 = (HelicsConfigJSON *)0x0;
  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (app->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pHVar2;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(app->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_30);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_120._M_pi);
  }
  return pHVar1;
}

Assistant:

HelicsConfigJSON* addJsonConfig(CLI::App* app)
{
    auto fmtr = std::make_shared<HelicsConfigJSON>();
    auto* fmtrRet = fmtr.get();
    app->allow_config_extras(CLI::config_extras_mode::ignore_all);
    app->add_option("--config_section",
                    fmtr->sectionRef(),
                    "specify the section of the config file to use")
        ->configurable(false)
        ->trigger_on_parse();
    app->add_option("--config_index",
                    fmtr->indexRef(),
                    "specify the section index of the config file to use for configuration arrays")
        ->configurable(false)
        ->trigger_on_parse();
    app->get_config_ptr()->check([fmtr](const std::string& filename) {
        if (CLI::ExistingFile(filename).empty()) {
            fmtr->skipJson(!fileops::hasJsonExtension(filename));
        }
        return std::string{};
    });

    app->config_formatter(std::move(fmtr));
    return fmtrRet;
}